

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall GLDrawList::SortSpriteIntoPlane(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  uint uVar2;
  GLDrawItem *pGVar3;
  GLFlat *pGVar4;
  GLSprite *pGVar5;
  GLSprite *pGVar6;
  SortNode *child;
  float fVar7;
  SortNode *sort2;
  float newtexv;
  GLSprite *ss1;
  GLSprite s;
  bool ceiling;
  GLSprite *ss;
  GLFlat *fh;
  SortNode *sort_local;
  SortNode *head_local;
  GLDrawList *this_local;
  
  pGVar3 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)head->itemindex);
  pGVar4 = TArray<GLFlat,_GLFlat>::operator[](&this->flats,(long)pGVar3->index);
  pGVar3 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sort->itemindex);
  pGVar5 = TArray<GLSprite,_GLSprite>::operator[](&this->sprites,(long)pGVar3->index);
  s.lightlist._7_1_ = ViewPos.Z < (double)pGVar4->z;
  if (((pGVar4->z <= pGVar5->z1 && pGVar5->z1 != pGVar4->z) && (pGVar5->z2 < pGVar4->z)) ||
     (pGVar5->modelframe != (FSpriteModelFrame *)0x0)) {
    memcpy(&ss1,pGVar5,0xa0);
    AddSprite(this,(GLSprite *)&ss1);
    if ((gl.flags & 0x20) != 0) {
      uVar2 = TArray<GLSprite,_GLSprite>::Size(&this->sprites);
      pGVar5 = TArray<GLSprite,_GLSprite>::operator[](&this->sprites,(ulong)(uVar2 - 1));
      pGVar3 = TArray<GLDrawItem,_GLDrawItem>::operator[](&this->drawitems,(long)sort->itemindex);
      pGVar6 = TArray<GLSprite,_GLSprite>::operator[](&this->sprites,(long)pGVar3->index);
      fVar7 = pGVar6->vt +
              ((pGVar6->vb - pGVar6->vt) / (pGVar6->z2 - pGVar6->z1)) * (pGVar4->z - pGVar6->z1);
      if ((s.lightlist._7_1_ & 1) == 0) {
        fVar1 = pGVar4->z;
        pGVar5->z2 = fVar1;
        pGVar6->z1 = fVar1;
        pGVar5->vb = fVar7;
        pGVar6->vt = fVar7;
      }
      else {
        fVar1 = pGVar4->z;
        pGVar6->z2 = fVar1;
        pGVar5->z1 = fVar1;
        pGVar6->vb = fVar7;
        pGVar5->vt = fVar7;
      }
    }
    child = StaticSortNodeArray::GetNew(&SortNodes);
    memset(child,0,0x30);
    uVar2 = TArray<GLDrawItem,_GLDrawItem>::Size(&this->drawitems);
    child->itemindex = uVar2 - 1;
    SortNode::AddToLeft(head,sort);
    SortNode::AddToRight(head,child);
  }
  else if (((pGVar5->z2 < pGVar4->z) && (!(bool)s.lightlist._7_1_)) ||
          ((pGVar4->z <= pGVar5->z1 && pGVar5->z1 != pGVar4->z && ((bool)s.lightlist._7_1_)))) {
    SortNode::AddToLeft(head,sort);
  }
  else {
    SortNode::AddToRight(head,sort);
  }
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoPlane(SortNode * head,SortNode * sort)
{
	GLFlat * fh=&flats[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];

	bool ceiling = fh->z > ViewPos.Z;

	if ((ss->z1>fh->z && ss->z2<fh->z) || ss->modelframe)
	{
		// We have to split this sprite
		GLSprite s=*ss;
		AddSprite(&s);	// add a copy to avoid reallocation issues.
	
		// Splitting is done in the shader with clip planes, if available
		if (gl.flags & RFL_NO_CLIP_PLANES)
		{
			GLSprite * ss1;
			ss1=&sprites[sprites.Size()-1];
			ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!
			float newtexv=ss->vt + ((ss->vb-ss->vt)/(ss->z2-ss->z1))*(fh->z-ss->z1);

			if (!ceiling)
			{
				ss->z1=ss1->z2=fh->z;
				ss->vt=ss1->vb=newtexv;
			}
			else
			{
				ss1->z1=ss->z2=fh->z;
				ss1->vt=ss->vb=newtexv;
			}
		}

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		head->AddToLeft(sort);
		head->AddToRight(sort2);
	}
	else if ((ss->z2<fh->z && !ceiling) || (ss->z1>fh->z && ceiling))	// completely on the left side
	{
		head->AddToLeft(sort);
	}
	else
	{
		head->AddToRight(sort);
	}

}